

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O2

void Abc_NtkCollectNonOverlapCands
               (Abc_Obj_t *pLut,Vec_Ptr_t *vStart,Vec_Ptr_t *vNext,Vec_Ptr_t *vCands,
               Nwk_LMPars_t *pPars)

{
  int iVar1;
  uint uVar2;
  void *Entry;
  Abc_Obj_t *p;
  uint uVar3;
  Vec_Ptr_t *vStart_00;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  
  vCands->nSize = 0;
  if (1 < pPars->nMaxSuppSize - (pLut->vFanins).nSize) {
    if (pPars->nMaxDistance < 1) {
      __assert_fail("pPars->nMaxDistance > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMerge.c"
                    ,0x98,
                    "void Abc_NtkCollectNonOverlapCands(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *, Nwk_LMPars_t *)"
                   );
    }
    vStart->nSize = 0;
    Vec_PtrPush(vStart,pLut);
    Abc_NtkIncrementTravId(pLut->pNtk);
    Abc_NodeSetTravIdCurrent(pLut);
    for (iVar7 = 1; vStart_00 = vStart, iVar7 <= pPars->nMaxDistance; iVar7 = iVar7 + 1) {
      Abc_NtkCollectCircle(vStart_00,vNext,pPars->nMaxFanout);
      for (iVar4 = 0; iVar4 < vNext->nSize; iVar4 = iVar4 + 1) {
        Entry = Vec_PtrEntry(vNext,iVar4);
        Vec_PtrPush(vCands,Entry);
      }
      vStart = vNext;
      vNext = vStart_00;
    }
    Abc_NtkIncrementTravId(pLut->pNtk);
    if (pPars->fUseTfiTfo == 0) {
      Abc_NodeSetTravIdPrevious(pLut);
      Abc_NtkMarkFanins_rec(pLut,(*(uint *)&pLut->field_0x14 >> 0xc) - pPars->nMaxDistance);
      Abc_NodeSetTravIdPrevious(pLut);
      Abc_NtkMarkFanouts_rec
                (pLut,(*(uint *)&pLut->field_0x14 >> 0xc) + pPars->nMaxDistance,pPars->nMaxFanout);
    }
    else {
      Abc_NodeSetTravIdCurrent(pLut);
    }
    iVar7 = 0;
    uVar5 = 0;
    while( true ) {
      iVar4 = (int)uVar5;
      if (vCands->nSize <= iVar7) break;
      p = (Abc_Obj_t *)Vec_PtrEntry(vCands,iVar7);
      iVar1 = Abc_NodeIsTravIdCurrent(p);
      uVar6 = uVar5;
      if (((iVar1 == 0) && ((p->vFanins).nSize + (pLut->vFanins).nSize <= pPars->nMaxSuppSize)) &&
         (uVar2 = *(uint *)&pLut->field_0x14 >> 0xc, uVar3 = *(uint *)&p->field_0x14 >> 0xc,
         (int)(uVar3 - uVar2) <= pPars->nMaxLevelDiff &&
         (int)(uVar2 - uVar3) <= pPars->nMaxLevelDiff)) {
        if ((iVar4 < 0) || (vCands->nSize <= iVar4)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        uVar6 = (ulong)(iVar4 + 1);
        vCands->pArray[uVar5] = p;
      }
      iVar7 = iVar7 + 1;
      uVar5 = uVar6;
    }
    if (vCands->nSize < iVar4) {
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                    ,0x232,"void Vec_PtrShrink(Vec_Ptr_t *, int)");
    }
    vCands->nSize = iVar4;
  }
  return;
}

Assistant:

void Abc_NtkCollectNonOverlapCands( Abc_Obj_t * pLut, Vec_Ptr_t * vStart, Vec_Ptr_t * vNext, Vec_Ptr_t * vCands, Nwk_LMPars_t * pPars )
{
    Vec_Ptr_t * vTemp;
    Abc_Obj_t * pObj;
    int i, k;
    Vec_PtrClear( vCands );
    if ( pPars->nMaxSuppSize - Abc_ObjFaninNum(pLut) <= 1 )
        return;

    // collect nodes removed by this distance
    assert( pPars->nMaxDistance > 0 );
    Vec_PtrClear( vStart );
    Vec_PtrPush( vStart, pLut );
    Abc_NtkIncrementTravId( pLut->pNtk );
    Abc_NodeSetTravIdCurrent( pLut );
    for ( i = 1; i <= pPars->nMaxDistance; i++ )
    {
        Abc_NtkCollectCircle( vStart, vNext, pPars->nMaxFanout );
        vTemp  = vStart;
        vStart = vNext;
        vNext  = vTemp;
        // collect the nodes in vStart
        Vec_PtrForEachEntry( Abc_Obj_t *, vStart, pObj, k )
            Vec_PtrPush( vCands, pObj );
    }

    // mark the TFI/TFO nodes
    Abc_NtkIncrementTravId( pLut->pNtk );
    if ( pPars->fUseTfiTfo )
        Abc_NodeSetTravIdCurrent( pLut );
    else
    {
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanins_rec( pLut, Abc_ObjLevel(pLut) - pPars->nMaxDistance );
        Abc_NodeSetTravIdPrevious( pLut );
        Abc_NtkMarkFanouts_rec( pLut, Abc_ObjLevel(pLut) + pPars->nMaxDistance, pPars->nMaxFanout );
    }

    // collect nodes satisfying the following conditions:
    // - they are close enough in terms of distance
    // - they are not in the TFI/TFO of the LUT
    // - they have no more than the given number of fanins
    // - they have no more than the given diff in delay
    k = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vCands, pObj, i )
    {
        if ( Abc_NodeIsTravIdCurrent(pObj) )
            continue;
        if ( Abc_ObjFaninNum(pLut) + Abc_ObjFaninNum(pObj) > pPars->nMaxSuppSize )
            continue;
        if ( Abc_ObjLevel(pLut) - Abc_ObjLevel(pObj) > pPars->nMaxLevelDiff || 
             Abc_ObjLevel(pObj) - Abc_ObjLevel(pLut) > pPars->nMaxLevelDiff )
             continue;
        Vec_PtrWriteEntry( vCands, k++, pObj );
    }
    Vec_PtrShrink( vCands, k );
}